

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::InitializeIntlForNumberPrototype(JavascriptLibrary *this)

{
  anon_class_1_0_00000001 numberPrototypeInitializer;
  JavascriptLibrary *this_local;
  
  InitializeIntlForPrototypes<Js::JavascriptLibrary::InitializeIntlForNumberPrototype()::__0>(this);
  return;
}

Assistant:

void JavascriptLibrary::InitializeIntlForNumberPrototype()
    {
        auto numberPrototypeInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::NumberPrototype);
        };
        InitializeIntlForPrototypes(numberPrototypeInitializer);
    }